

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meter.cc
# Opt level: O2

void __thiscall cppmetrics::Meter::Meter(Meter *this,Clock *clock)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (clock == (Clock *)0x0) {
    clock = GetDefaultClock();
  }
  this->m_clock = clock;
  (this->m_count).super___atomic_base<long>._M_i = 0;
  iVar1 = (**clock->_vptr_Clock)(clock);
  (this->m_start_time).__r = CONCAT44(extraout_var,iVar1);
  (this->m_last_tick).super___atomic_base<long_long>._M_i = CONCAT44(extraout_var,iVar1);
  EWMA::one_minute();
  EWMA::five_minutes();
  EWMA::fifteen_minutes();
  return;
}

Assistant:

Meter::Meter(Clock* clock)
    : m_clock(clock != nullptr ? clock : GetDefaultClock())
    , m_count(0)
    , m_start_time(m_clock->tick())
    , m_last_tick(m_start_time.count())
    , m_m1( EWMA::one_minute() )
    , m_m5( EWMA::five_minutes() )
    , m_m15( EWMA::fifteen_minutes() )
{}